

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAddLinkOptionsCommand.h
# Opt level: O0

cmCommand * __thiscall cmAddLinkOptionsCommand::Clone(cmAddLinkOptionsCommand *this)

{
  cmCommand *this_00;
  cmAddLinkOptionsCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x30);
  cmAddLinkOptionsCommand((cmAddLinkOptionsCommand *)this_00);
  return this_00;
}

Assistant:

cmCommand* Clone() override { return new cmAddLinkOptionsCommand; }